

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O3

bool __thiscall ipx::Iterate::feasible(Iterate *this)

{
  Model *pMVar1;
  undefined1 auVar2 [16];
  int iVar3;
  
  Evaluate(this);
  pMVar1 = this->model_;
  auVar2._8_8_ = -(ulong)(this->dresidual_ <= this->feasibility_tol_ * (pMVar1->norm_c_ + 1.0));
  auVar2._0_8_ = -(ulong)(this->presidual_ <= this->feasibility_tol_ * (pMVar1->norm_bounds_ + 1.0))
  ;
  iVar3 = movmskpd((int)pMVar1,auVar2);
  return iVar3 == 3;
}

Assistant:

bool Iterate::feasible() const {
    Evaluate();
    const double bounds_measure = 1.0 + model_.norm_bounds();
    const double costs_measure = 1.0 + model_.norm_c();
    const double rel_presidual = presidual_ / bounds_measure;
    const double rel_dresidual = dresidual_ / costs_measure;
    const bool primal_feasible = presidual_ <= feasibility_tol_ * (bounds_measure);
    const bool dual_feasible = dresidual_ <= feasibility_tol_ * (costs_measure);
    const bool is_feasible = primal_feasible && dual_feasible;
    if (kTerminationLogging) {
      printf("\nIterate::feasible presidual_ = %11.4g; bounds_measure = %11.4g; "
	     "rel_presidual = %11.4g; feasibility_tol = %11.4g: primal_feasible = %d\n",
	     presidual_, bounds_measure, rel_presidual, feasibility_tol_, primal_feasible);
      printf("Iterate::feasible dresidual_ = %11.4g;  costs_measure = %11.4g; "
	     "rel_dresidual = %11.4g; feasibility_tol = %11.4g:   dual_feasible = %d\n",
	     dresidual_, costs_measure, rel_dresidual, feasibility_tol_, dual_feasible);
    }
    return is_feasible;
}